

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

SerializationCompatibility *
duckdb::SerializationCompatibility::FromIndex
          (SerializationCompatibility *__return_storage_ptr__,idx_t version)

{
  (__return_storage_ptr__->duckdb_version)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->duckdb_version).field_2;
  (__return_storage_ptr__->duckdb_version)._M_string_length = 0;
  (__return_storage_ptr__->duckdb_version).field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1f90e71);
  __return_storage_ptr__->serialization_version = version;
  __return_storage_ptr__->manually_set = false;
  return __return_storage_ptr__;
}

Assistant:

SerializationCompatibility SerializationCompatibility::FromIndex(const idx_t version) {
	SerializationCompatibility result;
	result.duckdb_version = "";
	result.serialization_version = version;
	result.manually_set = false;
	return result;
}